

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

long __thiscall
tf::Serializer<std::ofstream,long>::operator()
          (Serializer<std::ofstream,long> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *items,TaskType *items_1
          ,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *items_2,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *items_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_nullptr>
                    ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)this,
                     items);
  lVar2 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_tf::TaskType_&,_nullptr>
                    ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)this,
                     items_1);
  lVar3 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_nullptr>
                    ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)this,
                     items_2);
  lVar4 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_nullptr>
                    ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)this,
                     items_3);
  return lVar4 + lVar3 + lVar2 + lVar1;
}

Assistant:

SizeType Serializer<Stream, SizeType>::operator() (T&&... items) {
  return (_save(std::forward<T>(items)) + ...);
}